

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizard::setField(QWizard *this,QString *name,QVariant *value)

{
  long lVar1;
  char cVar2;
  const_iterator cVar3;
  _Base_ptr *pp_Var4;
  QVariant *pQVar5;
  long lVar6;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (*(long *)(lVar1 + 0x300) == 0) {
    pp_Var4 = (_Base_ptr *)&stack0xffffffffffffffdc;
  }
  else {
    cVar3 = std::
            _Rb_tree<QString,_std::pair<const_QString,_int>,_std::_Select1st<std::pair<const_QString,_int>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>
            ::find((_Rb_tree<QString,_std::pair<const_QString,_int>,_std::_Select1st<std::pair<const_QString,_int>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>
                    *)(*(long *)(lVar1 + 0x300) + 8),name);
    pp_Var4 = (_Base_ptr *)&stack0xffffffffffffffdc;
    if (cVar3._M_node != (_Base_ptr)(*(long *)(lVar1 + 0x300) + 0x10)) {
      pp_Var4 = &cVar3._M_node[1]._M_right;
    }
  }
  if ((long)*(int *)pp_Var4 == -1) {
    setField();
  }
  else {
    lVar1 = *(long *)(lVar1 + 0x2f0);
    lVar6 = (long)*(int *)pp_Var4 * 0x80;
    pQVar5 = *(QVariant **)(lVar1 + 0x38 + lVar6);
    if (pQVar5 == (QVariant *)0x0) {
      pQVar5 = (QVariant *)&QByteArray::_empty;
    }
    cVar2 = QObject::doSetProperty(*(char **)(lVar1 + 0x28 + lVar6),pQVar5,value);
    if (cVar2 == '\0') {
      setField((QWizard *)(lVar1 + lVar6 + 0x38));
    }
  }
  return;
}

Assistant:

void QWizard::setField(const QString &name, const QVariant &value)
{
    Q_D(QWizard);

    int index = d->fieldIndexMap.value(name, -1);
    if (Q_UNLIKELY(index == -1)) {
        qWarning("QWizard::setField: No such field '%ls'", qUtf16Printable(name));
        return;
    }

    const QWizardField &field = d->fields.at(index);
    if (Q_UNLIKELY(!field.object->setProperty(field.property, value)))
        qWarning("QWizard::setField: Couldn't write to property '%s'",
                 field.property.constData());
}